

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_chk2cmp2_16_ai(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool local_25;
  uint local_24;
  bool local_1e;
  bool local_1d;
  sint upper_bound;
  sint lower_bound;
  uint ea;
  sint compare;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar2 = m68ki_read_imm_16();
    uVar1 = m68ki_cpu.dar[uVar2 >> 0xc & 0xf];
    lower_bound = uVar1 & 0xffff;
    uVar5 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
    uVar3 = m68ki_read_16_fc(uVar5,m68ki_cpu.s_flag | m68ki_address_space);
    iVar4 = (int)(short)uVar3;
    uVar5 = m68ki_read_16_fc(uVar5 + 2,m68ki_cpu.s_flag | m68ki_address_space);
    iVar6 = (int)(short)uVar5;
    if ((uVar2 & 0x8000) == 0) {
      lower_bound = (sint)(short)uVar1;
    }
    local_1d = iVar6 == lower_bound || iVar4 == lower_bound;
    m68ki_cpu.not_z_flag = (uint)((local_1d ^ 0xffU) & 1);
    if (iVar6 < iVar4) {
      local_25 = iVar6 < lower_bound || lower_bound < iVar4;
      local_1e = local_25;
    }
    else {
      local_1e = lower_bound < iVar4 || iVar6 < lower_bound;
    }
    local_24 = (uint)local_1e;
    m68ki_cpu.c_flag = local_24 << 8;
    if ((local_24 != 0) && ((uVar2 & 0x800) != 0)) {
      m68ki_exception_trap(6);
    }
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_16_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xffff;
		uint ea = EA_AY_AI_16();
		sint lower_bound = (int16)m68ki_read_16(ea);
		sint upper_bound = (int16)m68ki_read_16(ea + 2);

		if(!BIT_F(word2))
			compare = (int32)(int16)compare;
 		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||

        FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;
	}
	m68ki_exception_illegal();
}